

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

bool inipp::detail::replace<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *from,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *to)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = false;
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)str,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)str,uVar1,(string *)from->_M_string_length);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline bool replace(std::basic_string<CharT> & str, const std::basic_string<CharT> & from, const std::basic_string<CharT> & to) {
	auto changed = false;
	size_t start_pos = 0;
	while ((start_pos = str.find(from, start_pos)) != std::basic_string<CharT>::npos) {
		str.replace(start_pos, from.length(), to);
		start_pos += to.length();
		changed = true;
	}
	return changed;
}